

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

Fra_Sml_t * Fra_SmlSimulateSeq(Aig_Man_t *pAig,int nPref,int nFrames,int nWords,int fCheckMiter)

{
  int iVar1;
  Fra_Sml_t *p_00;
  Fra_Sml_t *p;
  int fCheckMiter_local;
  int nWords_local;
  int nFrames_local;
  int nPref_local;
  Aig_Man_t *pAig_local;
  
  p_00 = Fra_SmlStart(pAig,nPref,nFrames,nWords);
  Fra_SmlInitialize(p_00,1);
  Fra_SmlSimulateOne(p_00);
  if (fCheckMiter != 0) {
    iVar1 = Fra_SmlCheckNonConstOutputs(p_00);
    p_00->fNonConstOut = iVar1;
  }
  return p_00;
}

Assistant:

Fra_Sml_t * Fra_SmlSimulateSeq( Aig_Man_t * pAig, int nPref, int nFrames, int nWords, int fCheckMiter )
{
    Fra_Sml_t * p;
    p = Fra_SmlStart( pAig, nPref, nFrames, nWords );
    Fra_SmlInitialize( p, 1 );
    Fra_SmlSimulateOne( p );
    if ( fCheckMiter )
        p->fNonConstOut = Fra_SmlCheckNonConstOutputs( p );
    return p;
}